

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ranges.cpp
# Opt level: O2

void test_parse_and_check_false
               (string_view range_str,string_view ver_str,version_compare_option option)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  bool bVar1;
  Flags resultDisposition;
  from_chars_result fVar2;
  string_view str;
  string_view str_00;
  SourceLineInfo local_1b8;
  range_set<int,_int,_int> rs;
  SourceLineInfo local_190;
  string_view ver_str_local;
  AssertionHandler catchAssertionHandler;
  StringRef local_128;
  string_view range_str_local;
  version<int,_int,_int> v;
  StringRef local_a0;
  StringRef local_90;
  ScopedMessage scopedMessage1;
  
  range_str_local._M_str = range_str._M_str;
  range_str_local._M_len = range_str._M_len;
  ver_str_local._M_str = ver_str._M_str;
  ver_str_local._M_len = ver_str._M_len;
  catchAssertionHandler.m_assertionInfo.macroName.m_start = "INFO";
  catchAssertionHandler.m_assertionInfo.macroName.m_size = 4;
  rs.ranges.
  super__Vector_base<semver::detail::range<int,_int,_int>,_std::allocator<semver::detail::range<int,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_15a677;
  rs.ranges.
  super__Vector_base<semver::detail::range<int,_int,_int>,_std::allocator<semver::detail::range<int,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x16;
  Catch::MessageBuilder::MessageBuilder
            ((MessageBuilder *)&v,(StringRef *)&catchAssertionHandler,(SourceLineInfo *)&rs,Info);
  Catch::ReusableStringStream::operator<<((ReusableStringStream *)&v,&range_str_local);
  std::operator<<((ostream *)v.prerelease_tag_._M_dataplus._M_p," : ");
  Catch::ReusableStringStream::operator<<((ReusableStringStream *)&v,&ver_str_local);
  Catch::ScopedMessage::ScopedMessage(&scopedMessage1,(MessageBuilder *)&v);
  Catch::MessageBuilder::~MessageBuilder((MessageBuilder *)&v);
  v.major_ = 0;
  v.minor_ = 1;
  v.patch_ = 0;
  v.prerelease_tag_._M_dataplus._M_p = (pointer)&v.prerelease_tag_.field_2;
  v.prerelease_tag_._M_string_length = 0;
  v.prerelease_tag_.field_2._M_local_buf[0] = '\0';
  v.build_metadata_._M_dataplus._M_p = (pointer)&v.build_metadata_.field_2;
  v.build_metadata_._M_string_length = 0;
  v.build_metadata_.field_2._M_local_buf[0] = '\0';
  v.prerelease_identifiers.
  super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  v.prerelease_identifiers.
  super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  v.prerelease_identifiers.
  super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  rs.ranges.
  super__Vector_base<semver::detail::range<int,_int,_int>,_std::allocator<semver::detail::range<int,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1363f6;
  rs.ranges.
  super__Vector_base<semver::detail::range<int,_int,_int>,_std::allocator<semver::detail::range<int,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x7;
  local_1b8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]semver/test/test_ranges.cpp";
  local_1b8.line = 0x19;
  Catch::StringRef::StringRef(&local_90,"semver::parse(ver_str, v)");
  capturedExpression_00.m_size = local_90.m_size;
  capturedExpression_00.m_start = local_90.m_start;
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&rs,&local_1b8,capturedExpression_00,Normal);
  str._M_str = (char *)&v;
  str._M_len = (size_t)ver_str_local._M_str;
  fVar2 = semver::detail::parse<int,int,int>
                    ((detail *)ver_str_local._M_len,str,(version<int,_int,_int> *)local_90.m_start);
  rs.ranges.
  super__Vector_base<semver::detail::range<int,_int,_int>,_std::allocator<semver::detail::range<int,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)fVar2.super_from_chars_result.ptr;
  rs.ranges.
  super__Vector_base<semver::detail::range<int,_int,_int>,_std::allocator<semver::detail::range<int,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(rs.ranges.
                         super__Vector_base<semver::detail::range<int,_int,_int>,_std::allocator<semver::detail::range<int,_int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                         fVar2.super_from_chars_result.ec);
  local_1b8.file = (char *)&rs;
  Catch::AssertionHandler::handleExpr<semver::from_chars_result_const&>
            (&catchAssertionHandler,(ExprLhs<const_semver::from_chars_result_&> *)&local_1b8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  rs.ranges.
  super__Vector_base<semver::detail::range<int,_int,_int>,_std::allocator<semver::detail::range<int,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rs.ranges.
  super__Vector_base<semver::detail::range<int,_int,_int>,_std::allocator<semver::detail::range<int,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  rs.ranges.
  super__Vector_base<semver::detail::range<int,_int,_int>,_std::allocator<semver::detail::range<int,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.file = "REQUIRE";
  local_1b8.line = 7;
  local_190.file =
       "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]semver/test/test_ranges.cpp";
  local_190.line = 0x1c;
  Catch::StringRef::StringRef(&local_a0,"semver::parse(range_str, rs)");
  capturedExpression.m_size = local_a0.m_size;
  capturedExpression.m_start = local_a0.m_start;
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_1b8,&local_190,capturedExpression,Normal);
  str_00._M_str = (char *)&rs;
  str_00._M_len = (size_t)range_str_local._M_str;
  fVar2 = semver::parse<int,int,int>
                    ((semver *)range_str_local._M_len,str_00,
                     (range_set<int,_int,_int> *)local_a0.m_start);
  local_1b8.file = fVar2.super_from_chars_result.ptr;
  local_1b8.line = CONCAT44(local_1b8.line._4_4_,fVar2.super_from_chars_result.ec);
  local_190.file = (char *)&local_1b8;
  Catch::AssertionHandler::handleExpr<semver::from_chars_result_const&>
            (&catchAssertionHandler,(ExprLhs<const_semver::from_chars_result_&> *)&local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_1b8.file = "REQUIRE_FALSE";
  local_1b8.line = 0xd;
  local_190.file =
       "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]semver/test/test_ranges.cpp";
  local_190.line = 0x1e;
  Catch::StringRef::StringRef(&local_128,"rs.contains(v, option)");
  resultDisposition = Catch::operator|(Normal,FalseTest);
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_1b8,&local_190,local_128,resultDisposition);
  bVar1 = semver::range_set<int,_int,_int>::contains(&rs,&v,option);
  local_1b8.file = (char *)CONCAT71(local_1b8.file._1_7_,bVar1);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_1b8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  std::
  vector<semver::detail::range<int,_int,_int>,_std::allocator<semver::detail::range<int,_int,_int>_>_>
  ::~vector(&rs.ranges);
  semver::version<int,_int,_int>::~version(&v);
  Catch::ScopedMessage::~ScopedMessage(&scopedMessage1);
  return;
}

Assistant:

static void test_parse_and_check_false(std::string_view range_str, std::string_view ver_str,
  semver::version_compare_option option = semver::version_compare_option::exclude_prerelease)
{
  INFO(range_str << " : " << ver_str);

  semver::version v;
  REQUIRE(semver::parse(ver_str, v));

  semver::range_set rs;
  REQUIRE(semver::parse(range_str, rs));

  REQUIRE_FALSE(rs.contains(v, option));
}